

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  animal a2;
  flags_storage<3UL> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  tfl::detail::flags_storage<3UL>::flags_storage<char>(&local_39,"101",3,'0','1');
  tfl::detail::flags_storage<3ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
            (&local_38,&local_39,'0','1');
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 != 0) {
    __assert_fail("a2.to_string() == \"101\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                  ,0x39,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_38._M_dataplus._M_p._1_7_,(byte)local_38._M_dataplus._M_p) !=
      &local_38.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_38._M_dataplus._M_p._1_7_,(byte)local_38._M_dataplus._M_p),
                    local_38.field_2._M_allocated_capacity + 1);
  }
  tfl::detail::flags_storage<3UL>::flags_storage<char>
            ((flags_storage<3UL> *)&local_38,"001",3,'0','1');
  if (((byte)local_38._M_dataplus._M_p & 5) == 1) {
    return 0;
  }
  __assert_fail("a3 == animal{flag<eats_meat>{1}}",
                "/workspace/llm4binary/github/license_c_cmakelists/compmaniak[P]typed_flags/example/example.cpp"
                ,0x3e,"int main()");
}

Assistant:

int main()
{
    // unlike std::bitset typed_flags allocates less memory
    assert( sizeof(animal) == 1 );
    
    // create flags from scratch
    animal wolf;
    wolf.set<eats_grass>(false);
    wolf.set<eats_meat, has_tail>();
    wolf.set(flag<has_tail>{1}, flag<eats_meat>{1});
    
    // create flags with flexible human-readable constructor
    wolf = animal{flag<has_tail>{1}, flag<eats_meat>{1}, flag<eats_grass>{0}};
    
    // test each flag separately
    assert( (wolf.test<eats_meat>() && wolf.test<has_tail>()) );
    
    // test group off flags in one call
    assert( (wolf.all<eats_meat, has_tail>()) );
    assert( (wolf.any<eats_meat, has_tail, eats_grass>()) );
    assert( (wolf.none<eats_grass>()) );
    
    // extract flag values
    flag<eats_meat> f1;
    flag<eats_grass> f2;
    flag<has_tail> f3;
    wolf.get(f1, f2);
    wolf.get(f3);
    assert( f1 && !f2 && f3 );
    
    // like std::bitset create flags from integers or strings 
    // and convert vice versa
    auto a1 = animal{3};
    auto a2 = animal{"101"};
    assert( a1.to_integral<int>() == 3 );
    assert( a2.to_string() == "101" );
    
    // there are bitwise member and non-member functions
    auto a3 = wolf;
    a3 &= animal{"001"};
    assert( a3 == animal{flag<eats_meat>{1}} );
    assert( (a3 | animal{2}) == animal{3} );
    
    //wolf.set<build_spaceships>(); // compile error!
    //wolf = engineer{1}; // compile error!
}